

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O3

err_t cmdStDo(u32 tests)

{
  bool_t bVar1;
  err_t eVar2;
  octet *poVar3;
  octet *poVar4;
  size_t pwd_len;
  octet oid [11];
  octet buf1 [16];
  char pwd [17];
  octet hash [32];
  octet privkey [32];
  octet buf [32];
  octet state [1024];
  octet local_638 [16];
  octet local_628 [64];
  ulong local_5e8;
  char acStack_5e0 [40];
  octet local_5b8 [32];
  octet local_598 [32];
  bign_params local_578;
  octet local_428 [1032];
  
  if ((tests & 0x1f) != 0) {
    if ((tests & 1) != 0) {
      bashHashStart(local_428,0x80);
      poVar3 = beltH();
      bashHashStepH(poVar3,0,local_428);
      bashHashStepG((octet *)&local_578,0x20,local_428);
      bVar1 = hexEq(&local_578,"114C3DFAE373D9BCBC3602D6386F2D6A2059BA1BF9048DBAA5146A6CB775709D");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bashPrgStart(local_428,0x100,2,(octet *)0x0,0,poVar3,0x20);
      poVar3 = beltH();
      bashPrgAbsorb(poVar3 + 0x20,0x5f,local_428);
      bashPrgRatchet(local_428);
      bashPrgSqueeze(local_628,0x10,local_428);
      bVar1 = hexEq(local_628,"71CC358A0D5082173DE04803F7E905CB");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bashPrgStart(local_428,0x80,1,poVar3 + 0x80,0x10,local_628,0x10);
      poVar3 = beltH();
      memCopy(&local_578,poVar3 + 0xa0,0x17);
      bashPrgEncr(&local_578,0x17,local_428);
      bVar1 = hexEq(&local_578,"51ED3B28D345FFD1AD22815B86ECC17C278C8FE8920214");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bashPrgStart(local_428,0x80,1,poVar3 + 0x80,0x10,local_628,0x10);
      bashPrgDecr(&local_578,0x17,local_428);
      poVar3 = beltH();
      bVar1 = memEq(&local_578,poVar3 + 0xa0,0x17);
      if (bVar1 == 0) {
        return 0x20a;
      }
    }
    if ((tests & 2) != 0) {
      poVar3 = beltH();
      eVar2 = belsShare3(local_428,5,3,0x20,poVar3);
      if (eVar2 != 0) {
        return 0x20a;
      }
      eVar2 = belsRecover2((octet *)&local_578,1,0x20,local_428);
      if (eVar2 != 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bVar1 = memEq(&local_578,poVar3,0x20);
      if (bVar1 != 0) {
        return 0x20a;
      }
      eVar2 = belsRecover2((octet *)&local_578,2,0x20,local_428);
      if (eVar2 != 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bVar1 = memEq(&local_578,poVar3,0x20);
      if (bVar1 != 0) {
        return 0x20a;
      }
      eVar2 = belsRecover2((octet *)&local_578,3,0x20,local_428);
      if (eVar2 != 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      bVar1 = memEq(&local_578,poVar3,0x20);
      if (bVar1 == 0) {
        return 0x20a;
      }
    }
    if ((tests & 4) != 0) {
      local_5e8._0_1_ = 'B';
      local_5e8._1_1_ = '1';
      local_5e8._2_1_ = '9';
      local_5e8._3_1_ = '4';
      local_5e8._4_1_ = 'B';
      local_5e8._5_1_ = 'A';
      local_5e8._6_1_ = 'C';
      local_5e8._7_1_ = '8';
      builtin_strncpy(acStack_5e0,"0A08F53B",9);
      poVar3 = beltH();
      memCopy(&local_578,poVar3,0x30);
      poVar3 = beltH();
      beltECBStart(local_428,poVar3 + 0x80,0x20);
      beltECBStepE(&local_578,0x10,local_428);
      bVar1 = hexEq(&local_578,"69CCA1C93557C9E3D66BC3E0FA88FA6E");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      memCopy(&local_578,poVar3 + 0x40,0x30);
      poVar3 = beltH();
      beltECBStart(local_428,poVar3 + 0xa0,0x20);
      beltECBStepD(&local_578,0x10,local_428);
      bVar1 = hexEq(&local_578,"0DC5300600CAB840B38448E5E993F421");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      poVar4 = beltH();
      beltMAC((octet *)&local_578,poVar3,0xd,poVar4 + 0x80,0x20);
      bVar1 = hexEq(&local_578,"7260DA60138F96C9");
      if (bVar1 == 0) {
        return 0x20a;
      }
      pwd_len = strLen((char *)&local_5e8);
      poVar3 = beltH();
      beltPBKDF2((octet *)&local_578,(octet *)&local_5e8,pwd_len,10000,poVar3 + 0xc0,8);
      bVar1 = hexEq(&local_578,"3D331BBBB1FBBB40E4BF22F6CB9A689EF13A77DC09ECF93291BFE42439A72E7D");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      poVar4 = beltH();
      beltCHEStart(local_428,poVar3 + 0x80,0x20,poVar4 + 0xc0);
      poVar3 = beltH();
      memCopy(&local_578,poVar3,0xf);
      beltCHEStepE(&local_578,0xf,local_428);
      poVar3 = beltH();
      beltCHEStepI(poVar3 + 0x10,0x20,local_428);
      beltCHEStepA(&local_578,0xf,local_428);
      beltCHEStepG(local_628,local_428);
      bVar1 = hexEq(&local_578,"BF3DAEAF5D18D2BCC30EA62D2E70A4");
      if (bVar1 == 0) {
        return 0x20a;
      }
      bVar1 = hexEq(local_628,"548622B844123FF7");
      if (bVar1 == 0) {
        return 0x20a;
      }
      bVar1 = beltCHEStepV(local_628,local_428);
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      poVar4 = beltH();
      beltCHEStart(local_428,poVar3 + 0xa0,0x20,poVar4 + 0xd0);
      poVar3 = beltH();
      memCopy(&local_578,poVar3 + 0x40,0x14);
      poVar3 = beltH();
      beltCHEStepI(poVar3 + 0x50,0x20,local_428);
      beltCHEStepA(&local_578,0x14,local_428);
      beltCHEStepD(&local_578,0x14,local_428);
      beltCHEStepG(local_628,local_428);
      bVar1 = hexEq(&local_578,"2BABF43EB37B5398A9068F31A3C758B762F44AA9");
      if (bVar1 == 0) {
        return 0x20a;
      }
      bVar1 = hexEq(local_628,"7D9D4F59D40D197D");
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      beltWBLStart(local_428,poVar3 + 0x80,0x20);
      poVar3 = beltH();
      memCopy(&local_578,poVar3,0x20);
      poVar3 = beltH();
      memCopy(local_578.p + 0x18,poVar3 + 0x20,0x10);
      beltWBLStepE(&local_578,0x30,local_428);
      bVar1 = hexEq(&local_578,
                    "49A38EE108D6C742E52B774F00A6EF98B106CBD13EA4FB0680323051BC04DF76E487B055C69BCF541176169F1DC9F6C8"
                   );
      if (bVar1 == 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      beltWBLStart(local_428,poVar3 + 0xa0,0x20);
      poVar3 = beltH();
      memCopy(&local_578,poVar3 + 0x40,0x30);
      beltWBLStepD(&local_578,0x30,local_428);
      bVar1 = hexEq(&local_578,"92632EE0C21AD9E09A39343E5C07DAA4889B03F2E6847EB152EC99F7A4D9F154");
      if (bVar1 == 0) {
        return 0x20a;
      }
      bVar1 = hexEq(local_578.p + 0x18,"B5EF68D8E4A39E567153DE13D72254EE");
      if (bVar1 == 0) {
        return 0x20a;
      }
      beltHashStart(local_428);
      poVar3 = beltH();
      beltHashStepH(poVar3,0xd,local_428);
      beltHashStepG(local_628,local_428);
      bVar1 = hexEq(local_628,"ABEF9725D4C5A83597A367D14494CC2542F20F659DDFECC961A3EC550CBA8C75");
      if (bVar1 == 0) {
        return 0x20a;
      }
    }
    if ((tests & 8) != 0) {
      builtin_memcpy(local_638,"\x06\t*p",5);
      local_638[5] = '\x02';
      local_638[6] = '\0';
      local_638[7] = '\"';
      local_638[8] = 'e';
      local_638[9] = '\x1f';
      local_638[10] = 'Q';
      hexTo(local_598,"1F66B5B84B7339674533F0329C74F21834281FED0732429E0C79235FC273E269");
      prngEchoStart(local_428,local_598,0x20);
      eVar2 = bignParamsStd(&local_578,"1.2.112.0.2.0.34.101.45.3.1");
      if (eVar2 != 0) {
        return 0x20a;
      }
      eVar2 = bignKeypairGen(local_598,local_628,&local_578,prngEchoStepR,local_428);
      if (eVar2 != 0) {
        return 0x20a;
      }
      bVar1 = hexEq(local_628,
                    "BD1A5650179D79E03FCEE49D4C2BD5DDF54CE46D0CF11E4FF87BF7A890857FD07AC6A60361E8C8173491686D461B2826190C2EDA5909054A9AB84D2AB9D99A90"
                   );
      if (bVar1 == 0) {
        return 0x20a;
      }
      eVar2 = bignPubkeyVal(&local_578,local_628);
      if (eVar2 != 0) {
        return 0x20a;
      }
      poVar3 = beltH();
      eVar2 = beltHash(local_5b8,poVar3,0xd);
      if (eVar2 != 0) {
        return 0x20a;
      }
      eVar2 = bignSign2((octet *)&local_5e8,&local_578,local_638,0xb,local_5b8,local_598,(void *)0x0
                        ,0);
      if (eVar2 != 0) {
        return 0x20a;
      }
      bVar1 = hexEq(&local_5e8,
                    "19D32B7E01E25BAE4A70EB6BCA42602CCA6A13944451BCC5D4C54CFD8737619C328B8A58FB9C68FD17D569F7D06495FB"
                   );
      if (bVar1 == 0) {
        return 0x20a;
      }
      eVar2 = bignVerify(&local_578,local_638,0xb,local_5b8,(octet *)&local_5e8,local_628);
      if (eVar2 != 0) {
        return 0x20a;
      }
      local_5e8 = local_5e8 ^ 1;
      eVar2 = bignVerify(&local_578,local_638,0xb,local_5b8,(octet *)&local_5e8,local_628);
      if (eVar2 == 0) {
        return 0x20a;
      }
    }
    if ((tests & 0x10) != 0) {
      poVar3 = beltH();
      memCopy(&local_578,poVar3,0x60);
      poVar3 = beltH();
      poVar4 = beltH();
      brngCTRStart(local_428,poVar3 + 0x80,poVar4 + 0xc0);
      brngCTRStepR(&local_578,0x60,local_428);
      bVar1 = hexEq(&local_578,
                    "1F66B5B84B7339674533F0329C74F21834281FED0732429E0C79235FC273E2694C0E74B2CD5811AD21F23DE7E0FA742C3ED6EC483C461CE15C33A77AA308B7D20F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5"
                   );
      if (bVar1 == 0) {
        return 0x20a;
      }
    }
  }
  if (((tests >> 0x18 & 1) != 0) && (eVar2 = cmdRngStart(1), eVar2 != 0)) {
    return eVar2;
  }
  if (((tests >> 0x19 & 1) != 0) && (eVar2 = cmdStampSelfVal(), eVar2 != 0)) {
    return eVar2;
  }
  return 0;
}

Assistant:

err_t cmdStDo(u32 tests)
{
	err_t code = ERR_OK;
	// algs?
	if (tests & CMD_ST_ALGS)
	{
		code = cmdStAlgs(tests);
		ERR_CALL_CHECK(code);
	}
	// rng?
	if (tests & CMD_ST_RNG)
	{
		code = cmdRngStart(TRUE);
		ERR_CALL_CHECK(code);
	}
	// stamp?
	if (tests & CMD_ST_STAMP)
	{
		code = cmdStampSelfVal();
		ERR_CALL_CHECK(code);
	}
	return code;
}